

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          Vec4 *scale,Vec4 *bias,qpImageCompressionMode compression)

{
  bool bVar1;
  TextureFormat *pTVar2;
  ConstPixelBufferAccess local_98;
  ConstPixelBufferAccess local_70;
  Vec4 *local_38;
  Vec4 *bias_local;
  Vec4 *scale_local;
  ConstPixelBufferAccess *access_local;
  string *description_local;
  string *name_local;
  LogImage *this_local;
  
  local_38 = bias;
  bias_local = scale;
  scale_local = (Vec4 *)access;
  access_local = (ConstPixelBufferAccess *)description;
  description_local = name;
  name_local = &this->m_name;
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)access_local);
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&this->m_access,(ConstPixelBufferAccess *)scale_local);
  Vector<float,_4>::Vector(&this->m_scale,bias_local);
  Vector<float,_4>::Vector(&this->m_bias,local_38);
  this->m_compression = compression;
  pTVar2 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)scale_local);
  bVar1 = isCombinedDepthStencilType(pTVar2->type);
  if (bVar1) {
    pTVar2 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)scale_local);
    if (pTVar2->order == D) {
      getEffectiveDepthStencilAccess(&local_70,(ConstPixelBufferAccess *)scale_local,MODE_DEPTH);
      memcpy(&this->m_access,&local_70,0x28);
    }
    pTVar2 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)scale_local);
    if (pTVar2->order == S) {
      getEffectiveDepthStencilAccess(&local_98,(ConstPixelBufferAccess *)scale_local,MODE_STENCIL);
      memcpy(&this->m_access,&local_98,0x28);
    }
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, const Vec4& scale, const Vec4& bias, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(scale)
	, m_bias		(bias)
	, m_compression	(compression)
{
	// Cannot set scale and bias of combined formats
	DE_ASSERT(access.getFormat().order != tcu::TextureFormat::DS);

	// Simplify access
	if (tcu::isCombinedDepthStencilType(access.getFormat().type))
	{
		if (access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH);
		if (access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL);
		else
		{
			// Cannot log a DS format
			DE_ASSERT(false);
			return;
		}
	}
}